

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::BuilderTest_build_gauge_Test::TestBody
          (BuilderTest_build_gauge_Test *this)

{
  Builder<prometheus::Gauge> *pBVar1;
  Family<prometheus::Gauge> *this_00;
  Builder<prometheus::Gauge> local_80;
  
  BuildGauge();
  pBVar1 = detail::Builder<prometheus::Gauge>::Name(&local_80,&(this->super_BuilderTest).name);
  pBVar1 = detail::Builder<prometheus::Gauge>::Help(pBVar1,&(this->super_BuilderTest).help);
  pBVar1 = detail::Builder<prometheus::Gauge>::Labels
                     (pBVar1,&(this->super_BuilderTest).const_labels);
  this_00 = detail::Builder<prometheus::Gauge>::Register(pBVar1,&(this->super_BuilderTest).registry)
  ;
  detail::Builder<prometheus::Gauge>::~Builder(&local_80);
  Family<prometheus::Gauge>::Add<>(this_00,&(this->super_BuilderTest).more_labels);
  BuilderTest::verifyCollectedLabels(&this->super_BuilderTest);
  return;
}

Assistant:

TEST_F(BuilderTest, build_gauge) {
  auto& family = BuildGauge()
                     .Name(name)
                     .Help(help)
                     .Labels(const_labels)
                     .Register(registry);
  family.Add(more_labels);

  verifyCollectedLabels();
}